

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# backward_references.cpp
# Opt level: O1

void CreateBackwardReferencesNH2
               (size_t num_bytes,size_t position,uint8_t *ringbuffer,size_t ringbuffer_mask,
               ContextLut literal_context_lut,BrotliEncoderParams *params,Hasher *hasher,
               int *dist_cache,size_t *last_insert_len,Command *commands,size_t *num_commands,
               size_t *num_literals)

{
  long lVar1;
  HasherCommon *pHVar2;
  uint16_t *puVar3;
  uint8_t uVar4;
  int iVar5;
  size_t sVar6;
  size_t sVar7;
  uint32_t *puVar8;
  BrotliEncoderDictionary *pBVar9;
  HasherCommon *pHVar10;
  void *pvVar11;
  void *pvVar12;
  ulong uVar13;
  BrotliDictionary *pBVar14;
  ulong uVar15;
  HasherCommon *pHVar16;
  int iVar17;
  ushort uVar18;
  undefined1 *puVar19;
  uint32_t uVar20;
  HasherCommon *pHVar21;
  HasherCommon *pHVar22;
  HasherCommon *pHVar23;
  ulong *puVar24;
  uint8_t *puVar25;
  byte bVar26;
  int iVar27;
  uint uVar28;
  long lVar29;
  HasherCommon *pHVar30;
  int iVar31;
  int iVar32;
  ulong uVar33;
  long lVar34;
  ulong *puVar35;
  ulong uVar36;
  ulong *puVar37;
  HasherCommon *pHVar38;
  ulong uVar39;
  ushort uVar40;
  HasherCommon *pHVar41;
  HasherCommon *pHVar42;
  HasherCommon *pHVar43;
  HasherCommon *pHVar44;
  uint8_t *puVar45;
  uint uVar46;
  ulong *puVar47;
  HasherCommon *pHVar48;
  ulong *puVar49;
  HasherCommon *unaff_R12;
  uint8_t *s1_orig;
  HasherCommon *pHVar50;
  HasherCommon *pHVar51;
  bool bVar52;
  HasherCommon *local_128;
  HasherCommon *local_118;
  Command *local_e8;
  size_t local_e0;
  uint local_bc;
  ulong local_98;
  uint local_68;
  
  local_e0 = *last_insert_len;
  puVar3 = (uint16_t *)(position + num_bytes);
  pHVar21 = (HasherCommon *)((position - 7) + num_bytes);
  if (num_bytes < 8) {
    pHVar21 = (HasherCommon *)position;
  }
  lVar29 = 0x200;
  if (params->quality < 9) {
    lVar29 = 0x40;
  }
  if ((uint16_t *)(position + 8) < puVar3) {
    pHVar38 = (HasherCommon *)((1L << ((byte)params->lgwin & 0x3f)) + -0x10);
    sVar6 = params->stream_offset;
    sVar7 = (params->dictionary).compound.total_size;
    pHVar41 = (HasherCommon *)(lVar29 + position);
    puVar8 = (hasher->privat)._H2.buckets_;
    lVar1 = sVar7 + 1;
    pHVar2 = (HasherCommon *)((long)puVar3 + -7);
    local_e8 = commands;
    pHVar30 = (HasherCommon *)position;
    do {
      pHVar22 = pHVar38;
      if (pHVar30 < pHVar38) {
        pHVar22 = pHVar30;
      }
      pHVar23 = (HasherCommon *)((long)pHVar30->extra + sVar6);
      if (pHVar38 <= pHVar23) {
        pHVar23 = pHVar38;
      }
      if ((params->dictionary).contextual.context_based == 0) {
        local_bc = 0;
        local_98 = 0;
      }
      else {
        if (pHVar30 == (HasherCommon *)0x0) {
          local_98 = 0;
        }
        else {
          local_98 = (ulong)ringbuffer[(ulong)&pHVar30[-1].field_0x4f & ringbuffer_mask];
        }
        if (pHVar30 < (HasherCommon *)0x2) {
          uVar33 = 0;
        }
        else {
          uVar33 = (ulong)ringbuffer[(ulong)&pHVar30[-1].field_0x4e & ringbuffer_mask];
        }
        local_bc = (uint)(params->dictionary).contextual.context_map
                         [literal_context_lut[uVar33 + 0x100] | literal_context_lut[local_98]];
      }
      local_118 = (HasherCommon *)((long)puVar3 - (long)pHVar30);
      pBVar9 = (params->dictionary).contextual.dict[local_bc];
      pHVar10 = (HasherCommon *)(params->dist).max_distance;
      uVar33 = (ulong)pHVar30 & ringbuffer_mask;
      pHVar51 = (HasherCommon *)(ringbuffer + uVar33);
      uVar4 = ringbuffer[uVar33];
      pHVar48 = (HasherCommon *)CONCAT71((int7)(local_e0 >> 8),uVar4);
      uVar33 = (ulong)(*(long *)(ringbuffer + uVar33) * 0x7bd3579bd3000000) >> 0x30;
      local_128 = (HasherCommon *)(long)*dist_cache;
      local_68 = (uint)ringbuffer_mask;
      pHVar43 = pHVar48;
      if (((HasherCommon *)((long)pHVar30 - (long)local_128) < pHVar30) &&
         (uVar46 = (uint)(HasherCommon *)((long)pHVar30 - (long)local_128) & local_68,
         uVar4 == ringbuffer[uVar46])) {
        puVar47 = (ulong *)(ringbuffer + uVar46);
        unaff_R12 = local_118;
        pHVar50 = pHVar51;
        puVar35 = puVar47;
        for (pHVar42 = local_118; (HasherCommon *)0x7 < pHVar42;
            pHVar42 = (HasherCommon *)&pHVar42[-1].is_prepared_) {
          pvVar11 = pHVar50->extra[0];
          pvVar12 = (void *)*puVar35;
          if (pvVar11 == pvVar12) {
            puVar35 = puVar35 + 1;
          }
          else {
            uVar36 = 0;
            if (((ulong)pvVar12 ^ (ulong)pvVar11) != 0) {
              for (; (((ulong)pvVar12 ^ (ulong)pvVar11) >> uVar36 & 1) == 0; uVar36 = uVar36 + 1) {
              }
            }
            unaff_R12 = (HasherCommon *)
                        ((long)puVar35 + ((uVar36 >> 3 & 0x1fffffff) - (long)puVar47));
          }
          if (pvVar11 != pvVar12) goto LAB_01c1573a;
          pHVar50 = (HasherCommon *)(pHVar50->extra + 1);
        }
        if (pHVar42 != (HasherCommon *)0x0) {
          pHVar44 = (HasherCommon *)0x0;
          do {
            pHVar16 = pHVar44;
            if (*(uint8_t *)((long)puVar35 + (long)pHVar44) !=
                *(uint8_t *)((long)pHVar44->extra + (long)pHVar50->extra)) break;
            pHVar44 = (HasherCommon *)((long)pHVar44->extra + 1);
            pHVar16 = pHVar42;
          } while (pHVar42 != pHVar44);
          puVar35 = (ulong *)((long)puVar35 + (long)pHVar16);
        }
        unaff_R12 = (HasherCommon *)((long)puVar35 - (long)puVar47);
LAB_01c1573a:
        if ((unaff_R12 < (HasherCommon *)0x4) ||
           (uVar36 = (long)unaff_R12 * 0x87 + 0x78f, uVar36 < 0x7e5)) goto LAB_01c15765;
        puVar8[uVar33] = (uint32_t)pHVar30;
LAB_01c15834:
        iVar32 = 0;
      }
      else {
LAB_01c15765:
        uVar46 = puVar8[uVar33];
        puVar8[uVar33] = (uint32_t)pHVar30;
        uVar36 = 0x7e4;
        if (uVar4 != ringbuffer[local_68 & uVar46]) {
          local_128 = (HasherCommon *)0x0;
          unaff_R12 = (HasherCommon *)0x0;
          goto LAB_01c15834;
        }
        iVar32 = 0;
        if ((pHVar30 == (HasherCommon *)(ulong)uVar46) ||
           (pHVar48 = (HasherCommon *)((long)pHVar30 - (long)(ulong)uVar46), pHVar22 < pHVar48)) {
          local_128 = (HasherCommon *)0x0;
          unaff_R12 = (HasherCommon *)0x0;
          pHVar43 = pHVar48;
          goto LAB_01c15834;
        }
        puVar47 = (ulong *)(ringbuffer + (local_68 & uVar46));
        pHVar43 = pHVar51;
        puVar35 = puVar47;
        for (pHVar22 = local_118; (HasherCommon *)0x7 < pHVar22;
            pHVar22 = (HasherCommon *)&pHVar22[-1].is_prepared_) {
          pvVar11 = pHVar43->extra[0];
          pvVar12 = (void *)*puVar35;
          if (pvVar11 == pvVar12) {
            puVar35 = puVar35 + 1;
          }
          else {
            uVar33 = 0;
            if (((ulong)pvVar12 ^ (ulong)pvVar11) != 0) {
              for (; (((ulong)pvVar12 ^ (ulong)pvVar11) >> uVar33 & 1) == 0; uVar33 = uVar33 + 1) {
              }
            }
            unaff_R12 = (HasherCommon *)
                        ((long)puVar35 + ((uVar33 >> 3 & 0x1fffffff) - (long)puVar47));
          }
          if (pvVar11 != pvVar12) goto LAB_01c15847;
          pHVar43 = (HasherCommon *)(pHVar43->extra + 1);
        }
        puVar37 = puVar35;
        if (pHVar22 != (HasherCommon *)0x0) {
          puVar37 = (ulong *)((long)puVar35 + (long)pHVar22);
          pHVar42 = (HasherCommon *)0x0;
          do {
            if (*(uint8_t *)((long)puVar35 + (long)pHVar42) !=
                *(uint8_t *)((long)pHVar42->extra + (long)pHVar43->extra)) {
              puVar37 = (ulong *)((long)puVar35 + (long)pHVar42);
              break;
            }
            pHVar42 = (HasherCommon *)((long)pHVar42->extra + 1);
          } while (pHVar22 != pHVar42);
        }
        unaff_R12 = (HasherCommon *)((long)puVar37 - (long)puVar47);
LAB_01c15847:
        if (unaff_R12 < (HasherCommon *)0x4) {
LAB_01c15878:
          pHVar43 = (hasher->privat)._H2.common;
          if (pHVar43->dict_num_lookups >> 7 <= pHVar43->dict_num_matches) {
            iVar32 = *(int *)pHVar51->extra;
            puVar25 = pBVar9->hash_table_lengths;
            pHVar43->dict_num_lookups = pHVar43->dict_num_lookups + 1;
            uVar33 = (ulong)((uint)(iVar32 * 0x1e35a7bd) >> 0x12);
            bVar26 = puVar25[uVar33 * 2];
            pHVar22 = (HasherCommon *)(ulong)bVar26;
            if (pHVar22 != (HasherCommon *)0x0) {
              if (local_118 < pHVar22) {
LAB_01c158c5:
                local_128 = (HasherCommon *)0x0;
                bVar52 = true;
                uVar36 = 0x7e4;
                unaff_R12 = (HasherCommon *)0x0;
                iVar32 = 0;
              }
              else {
                unaff_R12 = (HasherCommon *)pBVar9->hash_table_words;
                uVar33 = (ulong)*(ushort *)((long)unaff_R12->extra + uVar33 * 4);
                pBVar14 = pBVar9->words;
                puVar35 = (ulong *)(pBVar14->data +
                                   (ulong)pBVar14->offsets_by_length[(long)pHVar22] +
                                   uVar33 * (long)pHVar22);
                pHVar48 = pHVar22;
                pHVar42 = pHVar51;
                if (7 < bVar26) {
                  do {
                    pvVar11 = (void *)*puVar35;
                    pvVar12 = pHVar42->extra[0];
                    if (pvVar11 == pvVar12) {
                      pHVar42 = (HasherCommon *)(pHVar42->extra + 1);
                    }
                    else {
                      uVar36 = 0;
                      if (((ulong)pvVar12 ^ (ulong)pvVar11) != 0) {
                        for (; (((ulong)pvVar12 ^ (ulong)pvVar11) >> uVar36 & 1) == 0;
                            uVar36 = uVar36 + 1) {
                        }
                      }
                      unaff_R12 = (HasherCommon *)
                                  ((long)pHVar42 + ((uVar36 >> 3 & 0x1fffffff) - (long)pHVar51));
                    }
                    if (pvVar11 != pvVar12) goto LAB_01c16300;
                    puVar35 = puVar35 + 1;
                    pHVar48 = (HasherCommon *)&pHVar48[-1].is_prepared_;
                  } while ((int *)0x7 < pHVar48);
                }
                if (pHVar48 != (HasherCommon *)0x0) {
                  pHVar50 = (HasherCommon *)0x0;
                  do {
                    pHVar44 = pHVar50;
                    if (*(uint8_t *)((long)pHVar50->extra + (long)pHVar42->extra) !=
                        *(uint8_t *)((long)puVar35 + (long)pHVar50)) break;
                    pHVar50 = (HasherCommon *)((long)pHVar50->extra + 1);
                    pHVar44 = pHVar48;
                  } while (pHVar48 != pHVar50);
                  pHVar42 = (HasherCommon *)((long)pHVar44->extra + (long)pHVar42->extra);
                }
                unaff_R12 = (HasherCommon *)((long)pHVar42 - (long)pHVar51);
LAB_01c16300:
                if (unaff_R12 == (HasherCommon *)0x0) goto LAB_01c158c5;
                if ((pHVar22 < (HasherCommon *)
                               ((long)unaff_R12->extra + (ulong)pBVar9->cutoffTransformsCount)) &&
                   (local_128 = (HasherCommon *)
                                ((long)pHVar23->extra +
                                ((ulong)((uint)(pBVar9->cutoffTransforms >>
                                               ((char)((long)pHVar22 - (long)unaff_R12) * '\x06' &
                                               0x3fU)) & 0x3f) +
                                 ((long)pHVar22 - (long)unaff_R12) * 4 <<
                                (*(byte *)((long)pHVar22->extra + (long)pBVar14) & 0x3f)) +
                                uVar33 + lVar1), local_128 <= pHVar10)) {
                  iVar32 = 0x1f;
                  if ((uint)local_128 != 0) {
                    for (; (uint)local_128 >> iVar32 == 0; iVar32 = iVar32 + -1) {
                    }
                  }
                  uVar36 = ((long)unaff_R12 * 0x87 - (ulong)(uint)(iVar32 * 0x1e)) + 0x780;
                  if (uVar36 < 0x7e4) goto LAB_01c158c5;
                  iVar32 = (uint)bVar26 - (int)unaff_R12;
                  bVar52 = false;
                }
                else {
                  unaff_R12 = (HasherCommon *)0x0;
                  local_128 = (HasherCommon *)0x0;
                  iVar32 = 0;
                  uVar36 = 0x7e4;
                  bVar52 = true;
                }
              }
              if (!bVar52) {
                pHVar43->dict_num_matches = pHVar43->dict_num_matches + 1;
              }
              goto LAB_01c158e2;
            }
          }
          local_128 = (HasherCommon *)0x0;
          uVar36 = 0x7e4;
          unaff_R12 = (HasherCommon *)0x0;
          iVar32 = 0;
        }
        else {
          iVar5 = 0x1f;
          local_128._0_4_ = (uint)pHVar48;
          if ((uint)local_128 != 0) {
            for (; (uint)local_128 >> iVar5 == 0; iVar5 = iVar5 + -1) {
            }
          }
          uVar36 = (ulong)(iVar5 * -0x1e + 0x780) + (long)unaff_R12 * 0x87;
          local_128 = pHVar48;
          if (uVar36 < 0x7e5) goto LAB_01c15878;
        }
      }
LAB_01c158e2:
      if (uVar36 < 0x7e5) {
        local_e0 = local_e0 + 1;
        position = (long)pHVar30->extra + 1;
        if (pHVar41 < position) {
          if ((HasherCommon *)((long)pHVar41->extra + (ulong)(uint)((int)lVar29 * 4)) < position) {
            pHVar30 = (HasherCommon *)((long)pHVar30->extra + 0x11);
            if (pHVar2 <= pHVar30) {
              pHVar30 = pHVar2;
            }
            for (; position < pHVar30; position = (long)((HasherCommon *)position)->extra + 4) {
              puVar8[(ulong)(*(long *)(ringbuffer + (position & ringbuffer_mask)) *
                            0x7bd3579bd3000000) >> 0x30] = (uint32_t)position;
              local_e0 = local_e0 + 4;
            }
          }
          else {
            pHVar30 = (HasherCommon *)((long)pHVar30->extra + 9);
            if (pHVar2 <= pHVar30) {
              pHVar30 = pHVar2;
            }
            for (; position < pHVar30; position = (long)((HasherCommon *)position)->extra + 2) {
              puVar8[(ulong)(*(long *)(ringbuffer + (position & ringbuffer_mask)) *
                            0x7bd3579bd3000000) >> 0x30] = (uint32_t)position;
              local_e0 = local_e0 + 2;
            }
          }
        }
      }
      else {
        iVar5 = *dist_cache;
        iVar17 = 0;
        do {
          local_118 = (HasherCommon *)&local_118[-1].field_0x4f;
          pHVar41 = (HasherCommon *)&unaff_R12[-1].field_0x4f;
          if (local_118 <= &unaff_R12[-1].field_0x4f) {
            pHVar41 = local_118;
          }
          if (4 < params->quality) {
            pHVar41 = (HasherCommon *)0x0;
          }
          pHVar22 = (HasherCommon *)((long)pHVar30->extra + 1);
          pHVar23 = pHVar38;
          if (pHVar22 < pHVar38) {
            pHVar23 = pHVar22;
          }
          pHVar51 = (HasherCommon *)((long)pHVar30->extra + sVar6 + 1);
          if (pHVar38 <= pHVar51) {
            pHVar51 = pHVar38;
          }
          if ((params->dictionary).contextual.context_based == 0) {
            uVar33 = (ulong)local_bc;
          }
          else {
            uVar33 = (ulong)(params->dictionary).contextual.context_map
                            [literal_context_lut[local_98 + 0x100] |
                             literal_context_lut[ringbuffer[(ulong)pHVar30 & ringbuffer_mask]]];
            local_98 = (ulong)ringbuffer[(ulong)pHVar30 & ringbuffer_mask];
          }
          local_bc = (uint)uVar33;
          pBVar9 = (params->dictionary).contextual.dict[uVar33];
          puVar35 = (ulong *)(ringbuffer + ((ulong)pHVar22 & ringbuffer_mask));
          uVar4 = *(uint8_t *)((long)pHVar41->extra + (long)puVar35);
          uVar33 = (ulong)(*(long *)(ringbuffer + ((ulong)pHVar22 & ringbuffer_mask)) *
                          0x7bd3579bd3000000) >> 0x30;
          pHVar48 = (HasherCommon *)((long)pHVar22 - (long)iVar5);
          if ((pHVar48 < pHVar22) &&
             (puVar49 = (ulong *)(ringbuffer + ((uint)pHVar48 & local_68)),
             puVar19 = (undefined1 *)local_118, puVar47 = puVar35, puVar37 = puVar49,
             uVar4 == *(uint8_t *)((long)pHVar41->extra + (long)puVar49))) {
            for (; (undefined1 *)0x7 < puVar19; puVar19 = puVar19 + -8) {
              uVar39 = *puVar47;
              uVar13 = *puVar37;
              if (uVar39 == uVar13) {
                puVar37 = puVar37 + 1;
              }
              else {
                uVar15 = 0;
                if ((uVar13 ^ uVar39) != 0) {
                  for (; ((uVar13 ^ uVar39) >> uVar15 & 1) == 0; uVar15 = uVar15 + 1) {
                  }
                }
                pHVar43 = (HasherCommon *)
                          ((long)puVar37 + ((uVar15 >> 3 & 0x1fffffff) - (long)puVar49));
              }
              if (uVar39 != uVar13) goto LAB_01c15a82;
              puVar47 = puVar47 + 1;
            }
            puVar24 = puVar37;
            if (puVar19 != (undefined1 *)0x0) {
              puVar24 = (ulong *)((long)puVar37 + (long)puVar19);
              lVar34 = 0;
              do {
                if (*(char *)((long)puVar37 + lVar34) != *(char *)((long)puVar47 + lVar34)) {
                  puVar24 = (ulong *)((long)puVar37 + lVar34);
                  break;
                }
                lVar34 = lVar34 + 1;
              } while (puVar19 != (undefined1 *)lVar34);
            }
            pHVar43 = (HasherCommon *)((long)puVar24 - (long)puVar49);
LAB_01c15a82:
            if ((pHVar43 < (HasherCommon *)0x4) ||
               (uVar39 = (long)pHVar43 * 0x87 + 0x78f, uVar39 < 0x7e5)) goto LAB_01c15ac3;
            puVar8[uVar33] = (uint32_t)pHVar22;
            pHVar48 = (HasherCommon *)(long)iVar5;
            pHVar41 = pHVar43;
LAB_01c15b7f:
            iVar31 = 0;
            pHVar43 = pHVar41;
          }
          else {
LAB_01c15ac3:
            uVar46 = puVar8[uVar33];
            puVar8[uVar33] = (uint32_t)pHVar22;
            puVar47 = (ulong *)(ringbuffer + (local_68 & uVar46));
            uVar39 = 0x7e4;
            if ((uVar4 != *(uint8_t *)((long)pHVar41->extra + (long)puVar47)) ||
               ((pHVar22 == (HasherCommon *)(ulong)uVar46 ||
                (pHVar48 = (HasherCommon *)((long)pHVar22 - (long)(ulong)uVar46),
                puVar19 = (undefined1 *)local_118, puVar37 = puVar35, puVar49 = puVar47,
                pHVar23 < pHVar48)))) {
              pHVar48 = (HasherCommon *)0x0;
              goto LAB_01c15b7f;
            }
            for (; (undefined1 *)0x7 < puVar19; puVar19 = puVar19 + -8) {
              uVar33 = *puVar37;
              uVar39 = *puVar49;
              if (uVar33 == uVar39) {
                puVar49 = puVar49 + 1;
              }
              else {
                uVar13 = 0;
                if ((uVar39 ^ uVar33) != 0) {
                  for (; ((uVar39 ^ uVar33) >> uVar13 & 1) == 0; uVar13 = uVar13 + 1) {
                  }
                }
                pHVar43 = (HasherCommon *)
                          ((long)puVar49 + ((uVar13 >> 3 & 0x1fffffff) - (long)puVar47));
              }
              if (uVar33 != uVar39) goto LAB_01c15b92;
              puVar37 = puVar37 + 1;
            }
            puVar24 = puVar49;
            if (puVar19 != (undefined1 *)0x0) {
              puVar24 = (ulong *)((long)puVar49 + (long)puVar19);
              lVar34 = 0;
              do {
                if (*(char *)((long)puVar49 + lVar34) != *(char *)((long)puVar37 + lVar34)) {
                  puVar24 = (ulong *)((long)puVar49 + lVar34);
                  break;
                }
                lVar34 = lVar34 + 1;
              } while (puVar19 != (undefined1 *)lVar34);
            }
            pHVar43 = (HasherCommon *)((long)puVar24 - (long)puVar47);
LAB_01c15b92:
            iVar31 = 0;
            if (pHVar43 < (HasherCommon *)0x4) {
LAB_01c15bcd:
              pHVar23 = (hasher->privat)._H2.common;
              if (pHVar23->dict_num_lookups >> 7 <= pHVar23->dict_num_matches) {
                uVar33 = *puVar35;
                puVar25 = pBVar9->hash_table_lengths;
                pHVar23->dict_num_lookups = pHVar23->dict_num_lookups + 1;
                uVar33 = (ulong)((uint)((int)uVar33 * 0x1e35a7bd) >> 0x12);
                bVar26 = puVar25[uVar33 * 2];
                puVar25 = (uint8_t *)(ulong)bVar26;
                if (puVar25 != (uint8_t *)0x0) {
                  pHVar42 = (HasherCommon *)CONCAT71((int7)((ulong)pHVar43 >> 8),1);
                  if (local_118 < puVar25) {
                    iVar31 = 0;
                    pHVar48 = (HasherCommon *)0x0;
                    uVar39 = 0x7e4;
                    pHVar43 = pHVar41;
                  }
                  else {
                    pBVar14 = pBVar9->words;
                    puVar37 = (ulong *)(pBVar14->data +
                                       (ulong)pBVar14->offsets_by_length[(long)puVar25] +
                                       (ulong)pBVar9->hash_table_words[uVar33 * 2] * (long)puVar25);
                    pHVar43 = pHVar42;
                    puVar45 = puVar25;
                    puVar47 = puVar35;
                    if (7 < bVar26) {
                      do {
                        uVar39 = *puVar37;
                        uVar13 = *puVar47;
                        if (uVar39 == uVar13) {
                          puVar47 = puVar47 + 1;
                        }
                        else {
                          uVar15 = 0;
                          if ((uVar13 ^ uVar39) != 0) {
                            for (; ((uVar13 ^ uVar39) >> uVar15 & 1) == 0; uVar15 = uVar15 + 1) {
                            }
                          }
                          pHVar43 = (HasherCommon *)
                                    ((long)puVar47 + ((uVar15 >> 3 & 0x1fffffff) - (long)puVar35));
                        }
                        if (uVar39 != uVar13) goto LAB_01c15d39;
                        puVar37 = puVar37 + 1;
                        puVar45 = puVar45 + -8;
                      } while ((uint8_t *)0x7 < puVar45);
                    }
                    puVar49 = puVar47;
                    if (puVar45 != (uint8_t *)0x0) {
                      puVar49 = (ulong *)((long)puVar47 + (long)puVar45);
                      lVar34 = 0;
                      do {
                        if (*(char *)((long)puVar47 + lVar34) != *(char *)((long)puVar37 + lVar34))
                        {
                          puVar49 = (ulong *)((long)puVar47 + lVar34);
                          break;
                        }
                        lVar34 = lVar34 + 1;
                      } while (puVar45 != (uint8_t *)lVar34);
                    }
                    pHVar43 = (HasherCommon *)((long)puVar49 - (long)puVar35);
LAB_01c15d39:
                    if (((pHVar43 != (HasherCommon *)0x0) &&
                        (puVar25 < (uint8_t *)
                                   ((long)pHVar43->extra + (ulong)pBVar9->cutoffTransformsCount)))
                       && (pHVar48 = (HasherCommon *)
                                     ((long)pHVar51->extra +
                                     ((ulong)((uint)(pBVar9->cutoffTransforms >>
                                                    ((char)((long)puVar25 - (long)pHVar43) * '\x06'
                                                    & 0x3fU)) & 0x3f) +
                                      ((long)puVar25 - (long)pHVar43) * 4 <<
                                     (puVar25[(long)pBVar14] & 0x3f)) +
                                     (ulong)pBVar9->hash_table_words[uVar33 * 2] + lVar1),
                          pHVar48 <= pHVar10)) {
                      iVar31 = 0x1f;
                      if ((uint)pHVar48 != 0) {
                        for (; (uint)pHVar48 >> iVar31 == 0; iVar31 = iVar31 + -1) {
                        }
                      }
                      uVar39 = ((long)pHVar43 * 0x87 - (ulong)(uint)(iVar31 * 0x1e)) + 0x780;
                      if (0x7e3 < uVar39) {
                        iVar31 = (uint)bVar26 - (int)pHVar43;
                        pHVar42 = (HasherCommon *)0x0;
                        goto LAB_01c15dde;
                      }
                    }
                    pHVar48 = (HasherCommon *)0x0;
                    iVar31 = 0;
                    pHVar42 = (HasherCommon *)&DAT_00000001;
                    uVar39 = 0x7e4;
                    pHVar43 = pHVar41;
                  }
LAB_01c15dde:
                  if ((char)pHVar42 == '\0') {
                    pHVar23->dict_num_matches = pHVar23->dict_num_matches + 1;
                  }
                  goto LAB_01c15c2c;
                }
              }
              iVar31 = 0;
              uVar39 = 0x7e4;
              pHVar48 = (HasherCommon *)0x0;
              pHVar43 = pHVar41;
            }
            else {
              iVar27 = 0x1f;
              if ((uint)pHVar48 != 0) {
                for (; (uint)pHVar48 >> iVar27 == 0; iVar27 = iVar27 + -1) {
                }
              }
              uVar39 = (ulong)(iVar27 * -0x1e + 0x780) + (long)pHVar43 * 0x87;
              if (uVar39 < 0x7e5) goto LAB_01c15bcd;
            }
          }
LAB_01c15c2c:
          if (uVar39 < uVar36 + 0xaf) {
            bVar52 = false;
            uVar39 = uVar36;
            pHVar22 = pHVar30;
            iVar27 = iVar17;
            iVar31 = iVar32;
          }
          else {
            local_e0 = local_e0 + 1;
            iVar27 = iVar17 + 1;
            bVar52 = iVar17 < 3 && (uint16_t *)((long)pHVar30->extra + 9) < puVar3;
            unaff_R12 = pHVar43;
            local_128 = pHVar48;
          }
          uVar36 = uVar39;
          pHVar30 = pHVar22;
          iVar17 = iVar27;
          iVar32 = iVar31;
        } while (bVar52);
        pHVar41 = (HasherCommon *)((long)pHVar22->extra + sVar6);
        if (pHVar38 <= pHVar41) {
          pHVar41 = pHVar38;
        }
        pHVar41 = (HasherCommon *)((long)pHVar41->extra + sVar7);
        if (pHVar41 < local_128) {
LAB_01c15fe1:
          puVar25 = (uint8_t *)((long)local_128->extra + 0xf);
        }
        else {
          uVar46 = 0;
          bVar52 = false;
          if (local_128 != (HasherCommon *)(long)*dist_cache) {
            if (local_128 == (HasherCommon *)(long)dist_cache[1]) {
              uVar46 = 1;
LAB_01c15ec5:
              bVar52 = false;
            }
            else {
              puVar25 = (uint8_t *)((long)local_128 + (3 - (long)*dist_cache));
              if (puVar25 < (uint8_t *)0x7) {
                iVar32 = (int)puVar25;
                uVar46 = 0x9750468;
              }
              else {
                puVar25 = (uint8_t *)((long)local_128 + (3 - (long)dist_cache[1]));
                if ((uint8_t *)0x6 < puVar25) {
                  if (local_128 != (HasherCommon *)(long)dist_cache[2]) {
                    bVar52 = local_128 != (HasherCommon *)(long)dist_cache[3];
                    uVar46 = 3;
                    goto LAB_01c15fdd;
                  }
                  uVar46 = 2;
                  goto LAB_01c15ec5;
                }
                iVar32 = (int)puVar25;
                uVar46 = 0xfdb1ace;
              }
              uVar46 = uVar46 >> ((byte)(iVar32 << 2) & 0x1f) & 0xf;
              bVar52 = false;
            }
          }
LAB_01c15fdd:
          if (bVar52) goto LAB_01c15fe1;
          puVar25 = (uint8_t *)(ulong)uVar46;
        }
        if ((local_128 <= pHVar41) && (puVar25 != (uint8_t *)0x0)) {
          dist_cache[3] = dist_cache[2];
          *(undefined8 *)(dist_cache + 1) = *(undefined8 *)dist_cache;
          *dist_cache = (int)local_128;
        }
        local_e8->insert_len_ = (uint32_t)local_e0;
        local_e8->copy_len_ = iVar31 << 0x19 | (uint)unaff_R12;
        uVar33 = (ulong)(params->dist).num_direct_distance_codes;
        puVar45 = (uint8_t *)(uVar33 + 0x10);
        if (puVar25 < puVar45) {
          local_e8->dist_prefix_ = (uint16_t)puVar25;
          uVar20 = 0;
        }
        else {
          uVar20 = (params->dist).distance_postfix_bits;
          bVar26 = (byte)uVar20;
          puVar25 = puVar25 + ((4L << (bVar26 & 0x3f)) - uVar33) + -0x10;
          uVar46 = 0x1f;
          if ((uint)puVar25 != 0) {
            for (; (uint)puVar25 >> uVar46 == 0; uVar46 = uVar46 - 1) {
            }
          }
          uVar46 = (uVar46 ^ 0xffffffe0) + 0x1f;
          bVar52 = ((ulong)puVar25 >> ((ulong)uVar46 & 0x3f) & 1) != 0;
          iVar32 = uVar46 - uVar20;
          local_e8->dist_prefix_ =
               (short)((uint)bVar52 + iVar32 * 2 + 0xfffe << (bVar26 & 0x3f)) +
               (short)puVar45 + (~(ushort)(-1 << (bVar26 & 0x1f)) & (ushort)puVar25) |
               (short)iVar32 * 0x400;
          uVar20 = (uint32_t)
                   ((long)puVar25 - ((ulong)bVar52 + 2 << ((byte)uVar46 & 0x3f)) >> (bVar26 & 0x3f))
          ;
        }
        local_e8->dist_extra_ = uVar20;
        if (local_e0 < 6) {
          uVar33 = local_e0 & 0xffffffff;
        }
        else if (local_e0 < 0x82) {
          uVar46 = 0x1f;
          uVar28 = (uint)(local_e0 - 2);
          if (uVar28 != 0) {
            for (; uVar28 >> uVar46 == 0; uVar46 = uVar46 - 1) {
            }
          }
          uVar33 = (ulong)((int)(local_e0 - 2 >> ((char)(uVar46 ^ 0xffffffe0) + 0x1fU & 0x3f)) +
                           (uVar46 ^ 0xffffffe0) * 2 + 0x40);
        }
        else if (local_e0 < 0x842) {
          uVar28 = (uint32_t)local_e0 - 0x42;
          uVar46 = 0x1f;
          if (uVar28 != 0) {
            for (; uVar28 >> uVar46 == 0; uVar46 = uVar46 - 1) {
            }
          }
          uVar33 = (ulong)((uVar46 ^ 0xffe0) + 0x2a);
        }
        else {
          uVar33 = 0x15;
          if (0x1841 < local_e0) {
            uVar33 = (ulong)(ushort)(0x17 - (local_e0 < 0x5842));
          }
        }
        uVar46 = iVar31 + (uint)unaff_R12;
        if (uVar46 < 10) {
          uVar28 = uVar46 - 2;
        }
        else if (uVar46 < 0x86) {
          uVar46 = uVar46 - 6;
          uVar28 = 0x1f;
          if (uVar46 != 0) {
            for (; uVar46 >> uVar28 == 0; uVar28 = uVar28 - 1) {
            }
          }
          uVar28 = (int)((ulong)(long)(int)uVar46 >> ((char)(uVar28 ^ 0xffffffe0) + 0x1fU & 0x3f)) +
                   (uVar28 ^ 0xffffffe0) * 2 + 0x42;
        }
        else {
          uVar28 = 0x17;
          if (uVar46 < 0x846) {
            uVar28 = 0x1f;
            if (uVar46 - 0x46 != 0) {
              for (; uVar46 - 0x46 >> uVar28 == 0; uVar28 = uVar28 - 1) {
              }
            }
            uVar28 = (uVar28 ^ 0xffe0) + 0x2c;
          }
        }
        uVar18 = (ushort)uVar28;
        uVar40 = (uVar18 & 7) + ((ushort)uVar33 & 7) * 8;
        if ((((local_e8->dist_prefix_ & 0x3ff) == 0) && ((ushort)uVar33 < 8)) && (uVar18 < 0x10)) {
          if (7 < uVar18) {
            uVar40 = uVar40 | 0x40;
          }
        }
        else {
          iVar32 = (int)((uVar33 & 0xffff) >> 3) * 3 + ((uVar28 & 0xffff) >> 3);
          uVar40 = uVar40 + ((ushort)(0x520d40 >> ((char)iVar32 * '\x02' & 0x1fU)) & 0xc0) +
                            (short)iVar32 * 0x40 + 0x40;
        }
        local_e8->cmd_prefix_ = uVar40;
        *num_literals = *num_literals + local_e0;
        position = (long)unaff_R12->extra + (long)pHVar22->extra;
        pHVar30 = pHVar21;
        if (position < pHVar21) {
          pHVar30 = (HasherCommon *)position;
        }
        pHVar23 = (HasherCommon *)((long)pHVar22->extra + 2);
        if (local_128 < (HasherCommon *)((ulong)unaff_R12 >> 2)) {
          pHVar41 = (HasherCommon *)(position + (long)local_128 * -4);
          if (pHVar41 < pHVar23) {
            pHVar41 = pHVar23;
          }
          pHVar23 = pHVar41;
          if (pHVar30 < pHVar41) {
            pHVar23 = pHVar30;
          }
        }
        pHVar41 = (HasherCommon *)((long)pHVar22->extra + lVar29 + (long)unaff_R12 * 2);
        local_e8 = local_e8 + 1;
        if (pHVar23 < pHVar30) {
          do {
            puVar8[(ulong)(*(long *)(ringbuffer + ((ulong)pHVar23 & ringbuffer_mask)) *
                          0x7bd3579bd3000000) >> 0x30] = (uint32_t)pHVar23;
            pHVar23 = (HasherCommon *)((long)pHVar23->extra + 1);
          } while (pHVar30 != pHVar23);
        }
        local_e0 = 0;
      }
      pHVar30 = (HasherCommon *)position;
    } while (((HasherCommon *)position)->extra + 1 < puVar3);
  }
  else {
    local_e8 = commands;
  }
  *last_insert_len = (size_t)((long)puVar3 + (local_e0 - position));
  *num_commands = *num_commands + ((long)local_e8 - (long)commands >> 4);
  return;
}

Assistant:

static BROTLI_NOINLINE void EXPORT_FN(CreateBackwardReferences)(
    size_t num_bytes, size_t position,
    const uint8_t* ringbuffer, size_t ringbuffer_mask,
    ContextLut literal_context_lut, const BrotliEncoderParams* params,
    Hasher* hasher, int* dist_cache, size_t* last_insert_len,
    Command* commands, size_t* num_commands, size_t* num_literals) {
  HASHER()* privat = &hasher->privat.FN(_);
  /* Set maximum distance, see section 9.1. of the spec. */
  const size_t max_backward_limit = BROTLI_MAX_BACKWARD_LIMIT(params->lgwin);
  const size_t position_offset = params->stream_offset;

  const Command* const orig_commands = commands;
  size_t insert_length = *last_insert_len;
  const size_t pos_end = position + num_bytes;
  const size_t store_end = num_bytes >= FN(StoreLookahead)() ?
      position + num_bytes - FN(StoreLookahead)() + 1 : position;

  /* For speed up heuristics for random data. */
  const size_t random_heuristics_window_size =
      LiteralSpreeLengthForSparseSearch(params);
  size_t apply_random_heuristics = position + random_heuristics_window_size;
  const size_t gap = params->dictionary.compound.total_size;

  /* Minimum score to accept a backward reference. */
  const score_t kMinScore = BROTLI_SCORE_BASE + 100;

  FN(PrepareDistanceCache)(privat, dist_cache);

  while (position + FN(HashTypeLength)() < pos_end) {
    size_t max_length = pos_end - position;
    size_t max_distance = BROTLI_MIN(size_t, position, max_backward_limit);
    size_t dictionary_start = BROTLI_MIN(size_t,
        position + position_offset, max_backward_limit);
    HasherSearchResult sr;
    int dict_id = 0;
    uint8_t p1 = 0;
    uint8_t p2 = 0;
    if (params->dictionary.contextual.context_based) {
      p1 = position >= 1 ?
          ringbuffer[(size_t)(position - 1) & ringbuffer_mask] : 0;
      p2 = position >= 2 ?
          ringbuffer[(size_t)(position - 2) & ringbuffer_mask] : 0;
      dict_id = params->dictionary.contextual.context_map[
          BROTLI_CONTEXT(p1, p2, literal_context_lut)];
    }
    sr.len = 0;
    sr.len_code_delta = 0;
    sr.distance = 0;
    sr.score = kMinScore;
    FN(FindLongestMatch)(privat, params->dictionary.contextual.dict[dict_id],
        ringbuffer, ringbuffer_mask, dist_cache, position, max_length,
        max_distance, dictionary_start + gap, params->dist.max_distance, &sr);
    if (ENABLE_COMPOUND_DICTIONARY) {
      LookupCompoundDictionaryMatch(&params->dictionary.compound, ringbuffer,
          ringbuffer_mask, dist_cache, position, max_length,
          dictionary_start, params->dist.max_distance, &sr);
    }
    if (sr.score > kMinScore) {
      /* Found a match. Let's look for something even better ahead. */
      int delayed_backward_references_in_row = 0;
      --max_length;
      for (;; --max_length) {
        const score_t cost_diff_lazy = 175;
        HasherSearchResult sr2;
        sr2.len = params->quality < MIN_QUALITY_FOR_EXTENSIVE_REFERENCE_SEARCH ?
            BROTLI_MIN(size_t, sr.len - 1, max_length) : 0;
        sr2.len_code_delta = 0;
        sr2.distance = 0;
        sr2.score = kMinScore;
        max_distance = BROTLI_MIN(size_t, position + 1, max_backward_limit);
        dictionary_start = BROTLI_MIN(size_t,
            position + 1 + position_offset, max_backward_limit);
        if (params->dictionary.contextual.context_based) {
          p2 = p1;
          p1 = ringbuffer[position & ringbuffer_mask];
          dict_id = params->dictionary.contextual.context_map[
              BROTLI_CONTEXT(p1, p2, literal_context_lut)];
        }
        FN(FindLongestMatch)(privat,
            params->dictionary.contextual.dict[dict_id],
            ringbuffer, ringbuffer_mask, dist_cache, position + 1, max_length,
            max_distance, dictionary_start + gap, params->dist.max_distance,
            &sr2);
        if (ENABLE_COMPOUND_DICTIONARY) {
          LookupCompoundDictionaryMatch(
              &params->dictionary.compound, ringbuffer,
              ringbuffer_mask, dist_cache, position + 1, max_length,
              dictionary_start, params->dist.max_distance, &sr2);
        }
        if (sr2.score >= sr.score + cost_diff_lazy) {
          /* Ok, let's just write one byte for now and start a match from the
             next byte. */
          ++position;
          ++insert_length;
          sr = sr2;
          if (++delayed_backward_references_in_row < 4 &&
              position + FN(HashTypeLength)() < pos_end) {
            continue;
          }
        }
        break;
      }
      apply_random_heuristics =
          position + 2 * sr.len + random_heuristics_window_size;
      dictionary_start = BROTLI_MIN(size_t,
          position + position_offset, max_backward_limit);
      {
        /* The first 16 codes are special short-codes,
           and the minimum offset is 1. */
        size_t distance_code = ComputeDistanceCode(
            sr.distance, dictionary_start + gap, dist_cache);
        if ((sr.distance <= (dictionary_start + gap)) && distance_code > 0) {
          dist_cache[3] = dist_cache[2];
          dist_cache[2] = dist_cache[1];
          dist_cache[1] = dist_cache[0];
          dist_cache[0] = (int)sr.distance;
          FN(PrepareDistanceCache)(privat, dist_cache);
        }
        InitCommand(commands++, &params->dist, insert_length,
            sr.len, sr.len_code_delta, distance_code);
      }
      *num_literals += insert_length;
      insert_length = 0;
      /* Put the hash keys into the table, if there are enough bytes left.
         Depending on the hasher implementation, it can push all positions
         in the given range or only a subset of them.
         Avoid hash poisoning with RLE data. */
      {
        size_t range_start = position + 2;
        size_t range_end = BROTLI_MIN(size_t, position + sr.len, store_end);
        if (sr.distance < (sr.len >> 2)) {
          range_start = BROTLI_MIN(size_t, range_end, BROTLI_MAX(size_t,
              range_start, position + sr.len - (sr.distance << 2)));
        }
        FN(StoreRange)(privat, ringbuffer, ringbuffer_mask, range_start,
                       range_end);
      }
      position += sr.len;
    } else {
      ++insert_length;
      ++position;
      /* If we have not seen matches for a long time, we can skip some
         match lookups. Unsuccessful match lookups are very very expensive
         and this kind of a heuristic speeds up compression quite
         a lot. */
      if (position > apply_random_heuristics) {
        /* Going through uncompressible data, jump. */
        if (position >
            apply_random_heuristics + 4 * random_heuristics_window_size) {
          /* It is quite a long time since we saw a copy, so we assume
             that this data is not compressible, and store hashes less
             often. Hashes of non compressible data are less likely to
             turn out to be useful in the future, too, so we store less of
             them to not to flood out the hash table of good compressible
             data. */
          const size_t kMargin =
              BROTLI_MAX(size_t, FN(StoreLookahead)() - 1, 4);
          size_t pos_jump =
              BROTLI_MIN(size_t, position + 16, pos_end - kMargin);
          for (; position < pos_jump; position += 4) {
            FN(Store)(privat, ringbuffer, ringbuffer_mask, position);
            insert_length += 4;
          }
        } else {
          const size_t kMargin =
              BROTLI_MAX(size_t, FN(StoreLookahead)() - 1, 2);
          size_t pos_jump =
              BROTLI_MIN(size_t, position + 8, pos_end - kMargin);
          for (; position < pos_jump; position += 2) {
            FN(Store)(privat, ringbuffer, ringbuffer_mask, position);
            insert_length += 2;
          }
        }
      }
    }
  }
  insert_length += pos_end - position;
  *last_insert_len = insert_length;
  *num_commands += (size_t)(commands - orig_commands);
}